

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O3

void toktheach(toktdef *tab1,_func_void_void_ptr_toksdef_ptr *cb,void *ctx)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  errdef fr_;
  errdef local_168;
  
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    puVar1 = mcmlck((mcmcxdef *)tab1[1].toktfadd,
                    *(mcmon *)((long)&tab1[0x2b].tokterr + uVar4 * 2 + 4));
    local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
    if (local_168.errcode != 0) {
      tab1->tokterr->errcxptr = local_168.errprv;
      mcmunlck((mcmcxdef *)tab1[1].toktfadd,*(mcmon *)((long)&tab1[0x2b].tokterr + uVar4 * 2 + 4));
      errrse1(tab1->tokterr,&local_168);
    }
    local_168.errprv = tab1->tokterr->errcxptr;
    tab1->tokterr->errcxptr = &local_168;
    if (uVar3 == *(uint *)&tab1[0x2b].tokterr) {
      uVar6 = (uint)*(ushort *)((long)&tab1[0x3c].toktfsea + 2);
    }
    else {
      uVar6 = *(uint *)((long)&tab1[0x31].toktfsea + uVar4 * 4 + 4);
    }
    local_168.errcode = 0;
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        (*cb)(ctx,(toksdef *)(puVar1 + uVar5 + 8));
        uVar2 = (puVar1[uVar5 + 0xe] + 0x17 & 0xfffffff8) + (int)uVar5;
        uVar5 = (ulong)uVar2;
      } while (uVar2 < uVar6);
    }
    tab1->tokterr->errcxptr = local_168.errprv;
    mcmunlck((mcmcxdef *)tab1[1].toktfadd,*(mcmon *)((long)&tab1[0x2b].tokterr + uVar4 * 2 + 4));
    uVar3 = uVar3 + 1;
  } while (uVar3 <= *(uint *)&tab1[0x2b].tokterr);
  return;
}

Assistant:

void toktheach(toktdef *tab1,
               void (*cb)(void *, toksdef *), void *ctx)
{
    tokthdef *tab = (tokthdef *)tab1;
    uchar    *p;
    uint      max;
    uint      ofs;
    tokshdef *symh;
    toksdef  *sym;
    uint      siz;
    uint      i;
    
    for (i = 0 ; i <= tab->tokthpcnt ; ++i)
    {
        /* lock the current page */
        p = mcmlck(tab->tokthmem, tab->tokthpool[i]);
        
        ERRBEGIN(tab1->tokterr)

        max = (i == tab->tokthpcnt ? tab->tokthofs : tab->tokthfinal[i]);
        for (ofs = 0 ; ofs < max ; )
        {
            /* get this symbol */
            symh = (tokshdef *)(p + ofs);
            sym = &symh->tokshsc;
            
            /* call the user callback */
            (*cb)(ctx, sym);
            
            /* advance to the next symbol on this page */
            siz = sizeof(toksh1def) + sym->tokslen;
            ofs += osrndsz(siz);
        }
            
        ERRCLEAN(tab1->tokterr)
            mcmunlck(tab->tokthmem, tab->tokthpool[i]);
        ERRENDCLN(tab1->tokterr)
            
        /* done with current page; unlock it */
        mcmunlck(tab->tokthmem, tab->tokthpool[i]);
    }
}